

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::ProcessBailOutInfo(BackwardPass *this,Instr *instr)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  BailOutKind BVar6;
  BailOutKind BVar7;
  uint32 uVar8;
  BailOutInfo *pBVar9;
  undefined4 *puVar10;
  BailOutInfo *bailOutInfo;
  Instr *instr_local;
  BackwardPass *this_local;
  
  bVar3 = IR::Instr::IsByteCodeUsesInstr(instr);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x86b,"(!instr->IsByteCodeUsesInstr())","!instr->IsByteCodeUsesInstr()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (this->tag == BackwardPhase) {
    if (((*(uint *)&this->func->field_0x240 >> 4 & 1) == 0) &&
       (bVar3 = IR::Instr::HasBailOutInfo(instr), bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x86f,"(this->func->hasBailout || !instr->HasBailOutInfo())",
                         "this->func->hasBailout || !instr->HasBailOutInfo()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    bVar3 = IR::Instr::HasBailOutInfo(instr);
    if (((bVar3) &&
        (pBVar9 = IR::Instr::GetBailOutInfo(instr),
        pBVar9->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0)) &&
       ((BVar4 = Func::HasTry(this->func), BVar4 == 0 ||
        (bVar3 = Func::DoOptimizeTry(this->func), !bVar3)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x870,
                         "(!instr->HasBailOutInfo() || instr->GetBailOutInfo()->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()))"
                         ,
                         "!instr->HasBailOutInfo() || instr->GetBailOutInfo()->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry())"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
  }
  else {
    bVar3 = IsCollectionPass(this);
    if (!bVar3) {
      if (this->tag != DeadStorePhase) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x878,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      bVar3 = IR::Instr::HasBailOutInfo(instr);
      if (bVar3) {
        if ((*(uint *)&this->func->field_0x240 >> 4 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x87c,"(this->func->hasBailout)","this->func->hasBailout");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        bVar3 = DoByteCodeUpwardExposedUsed(this);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x87d,"(this->DoByteCodeUpwardExposedUsed())",
                             "this->DoByteCodeUpwardExposedUsed()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        pBVar9 = IR::Instr::GetBailOutInfo(instr);
        if (pBVar9->bailOutInstr == instr) {
          uVar5 = IR::Instr::GetByteCodeOffset(instr);
          if ((uVar5 == 0xffffffff) ||
             (uVar1 = pBVar9->bailOutOffset, uVar5 = IR::Instr::GetByteCodeOffset(instr),
             uVar5 < uVar1)) {
            uVar5 = IR::Instr::GetByteCodeOffset(instr);
            if (uVar5 != 0xffffffff) {
              BVar6 = IR::Instr::GetBailOutKind(instr);
              BVar7 = IR::operator~(BailOutKindBits);
              BVar6 = IR::operator&(BVar6,BVar7);
              if (BVar6 != BailOutOnImplicitCalls) {
                BVar6 = IR::Instr::GetBailOutKind(instr);
                BVar7 = IR::operator~(BailOutKindBits);
                BVar6 = IR::operator&(BVar6,BVar7);
                if (BVar6 != LazyBailOut) {
                  BVar6 = IR::Instr::GetBailOutKind(instr);
                  BVar7 = IR::operator~(BailOutKindBits);
                  BVar6 = IR::operator&(BVar6,BVar7);
                  if (BVar6 != BailOutInvalid) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                       ,0x890,
                                       "(instr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset || (instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCalls || (instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::LazyBailOut || (instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutInvalid)"
                                       ,
                                       "instr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset || (instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCalls || (instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::LazyBailOut || (instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutInvalid"
                                      );
                    if (!bVar3) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 0;
                  }
                }
              }
            }
            ProcessBailOutInfo(this,instr,pBVar9);
            bVar3 = IR::Instr::HasLazyBailOut(instr);
            if (bVar3) {
              ClearDstUseForPostOpLazyBailOut(this,instr);
            }
          }
          else {
            uVar5 = pBVar9->bailOutOffset;
            uVar8 = IR::Instr::GetByteCodeOffset(instr);
            if (uVar5 != uVar8) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x8a0,"(bailOutInfo->bailOutOffset == instr->GetByteCodeOffset())"
                                 ,"bailOutInfo->bailOutOffset == instr->GetByteCodeOffset()");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            if (this->preOpBailOutInstrToProcess != (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x8a1,"(!preOpBailOutInstrToProcess)",
                                 "!preOpBailOutInstrToProcess");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            this->preOpBailOutInstrToProcess = instr;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::ProcessBailOutInfo(IR::Instr * instr)
{
    Assert(!instr->IsByteCodeUsesInstr());
    if (this->tag == Js::BackwardPhase)
    {
        // We don't need to fill in the bailout instruction in backward pass
        Assert(this->func->hasBailout || !instr->HasBailOutInfo());
        Assert(!instr->HasBailOutInfo() || instr->GetBailOutInfo()->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()));
        return false;
    }

    if(IsCollectionPass())
    {
        return false;
    }
    Assert(tag == Js::DeadStorePhase);

    if (instr->HasBailOutInfo())
    {
        Assert(this->func->hasBailout);
        Assert(this->DoByteCodeUpwardExposedUsed());

        BailOutInfo * bailOutInfo = instr->GetBailOutInfo();

        // Only process the bailout info if this is the main bailout point (instead of shared)
        if (bailOutInfo->bailOutInstr == instr)
        {
            if(instr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset ||
                bailOutInfo->bailOutOffset > instr->GetByteCodeOffset())
            {
                // Currently, we only have post-op bailout with BailOutOnImplicitCalls,
                // LazyBailOut, or JIT inserted operation (which no byte code offsets).
                // If there are other bailouts that we want to bailout after the operation,
                // we have to make sure that it still doesn't do the implicit call
                // if it is done on the stack object.
                // Otherwise, the stack object will be passed to the implicit call functions.
                Assert(instr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset
                    || (instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCalls
                    || (instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::LazyBailOut
                    || (instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutInvalid);

                // This instruction bails out to a later byte-code instruction, so process the bailout info now
                this->ProcessBailOutInfo(instr, bailOutInfo);

                if (instr->HasLazyBailOut())
                {
                    this->ClearDstUseForPostOpLazyBailOut(instr);
                }
            }
            else
            {
                // This instruction bails out to the equivalent byte code instruction. This instruction and ByteCodeUses
                // instructions relevant to this instruction need to be processed before the bailout info for this instruction
                // can be processed, so that it can be determined what byte code registers are used by the equivalent byte code
                // instruction and need to be restored. Save the instruction for bailout info processing later.
                Assert(bailOutInfo->bailOutOffset == instr->GetByteCodeOffset());
                Assert(!preOpBailOutInstrToProcess);
                preOpBailOutInstrToProcess = instr;
            }
        }
    }

    return false;
}